

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O0

void __thiscall OpenMesh::ArrayKernel::assign_connectivity(ArrayKernel *this,ArrayKernel *_other)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PropertyT<OpenMesh::Attributes::StatusInfo> *pPVar3;
  PropertyT<OpenMesh::Attributes::StatusInfo> *pPVar4;
  ArrayKernel *_other_local;
  ArrayKernel *this_local;
  
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::
  operator=(&this->vertices_,&_other->vertices_);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::operator=
            (&this->edges_,&_other->edges_);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::operator=
            (&this->faces_,&_other->faces_);
  iVar2 = (*(this->super_BaseKernel)._vptr_BaseKernel[2])();
  BaseKernel::vprops_resize(&this->super_BaseKernel,CONCAT44(extraout_var,iVar2));
  iVar2 = (*(this->super_BaseKernel)._vptr_BaseKernel[3])();
  BaseKernel::hprops_resize(&this->super_BaseKernel,CONCAT44(extraout_var_00,iVar2));
  iVar2 = (*(this->super_BaseKernel)._vptr_BaseKernel[4])();
  BaseKernel::eprops_resize(&this->super_BaseKernel,CONCAT44(extraout_var_01,iVar2));
  iVar2 = (*(this->super_BaseKernel)._vptr_BaseKernel[5])();
  BaseKernel::fprops_resize(&this->super_BaseKernel,CONCAT44(extraout_var_02,iVar2));
  bVar1 = BaseHandle::is_valid((BaseHandle *)&_other->vertex_status_);
  if (bVar1) {
    bVar1 = BaseHandle::is_valid((BaseHandle *)&this->vertex_status_);
    if (!bVar1) {
      request_vertex_status(this);
    }
    pPVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       (&_other->super_BaseKernel,
                        (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (_other->vertex_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    pPVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       (&this->super_BaseKernel,
                        (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->vertex_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    PropertyT<OpenMesh::Attributes::StatusInfo>::operator=(pPVar4,pPVar3);
  }
  bVar1 = BaseHandle::is_valid((BaseHandle *)&_other->halfedge_status_);
  if (bVar1) {
    bVar1 = BaseHandle::is_valid((BaseHandle *)&this->halfedge_status_);
    if (!bVar1) {
      request_halfedge_status(this);
    }
    pPVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       (&_other->super_BaseKernel,
                        (HPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (_other->halfedge_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    pPVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       (&this->super_BaseKernel,
                        (HPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->halfedge_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    PropertyT<OpenMesh::Attributes::StatusInfo>::operator=(pPVar4,pPVar3);
  }
  bVar1 = BaseHandle::is_valid((BaseHandle *)&_other->edge_status_);
  if (bVar1) {
    bVar1 = BaseHandle::is_valid((BaseHandle *)&this->edge_status_);
    if (!bVar1) {
      request_edge_status(this);
    }
    pPVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       (&_other->super_BaseKernel,
                        (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (_other->edge_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    pPVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       (&this->super_BaseKernel,
                        (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->edge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>
                        .super_BaseHandle.idx_);
    PropertyT<OpenMesh::Attributes::StatusInfo>::operator=(pPVar4,pPVar3);
  }
  bVar1 = BaseHandle::is_valid((BaseHandle *)&_other->face_status_);
  if (bVar1) {
    bVar1 = BaseHandle::is_valid((BaseHandle *)&this->face_status_);
    if (!bVar1) {
      request_face_status(this);
    }
    pPVar3 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       (&_other->super_BaseKernel,
                        (FPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (_other->face_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    pPVar4 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       (&this->super_BaseKernel,
                        (FPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->face_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>
                        .super_BaseHandle.idx_);
    PropertyT<OpenMesh::Attributes::StatusInfo>::operator=(pPVar4,pPVar3);
  }
  return;
}

Assistant:

void ArrayKernel::assign_connectivity(const ArrayKernel& _other)
{
  vertices_ = _other.vertices_;
  edges_ = _other.edges_;
  faces_ = _other.faces_;
  
  vprops_resize(n_vertices());
  hprops_resize(n_halfedges());
  eprops_resize(n_edges());
  fprops_resize(n_faces());
  
#define COPY_STATUS_PROPERTY(ENTITY) \
  if (_other.ENTITY##_status_.is_valid()) \
  {   \
    if (!ENTITY##_status_.is_valid()) \
    { \
      request_##ENTITY##_status(); \
    } \
    property(ENTITY##_status_) = _other.property(_other.ENTITY##_status_); \
  }
  COPY_STATUS_PROPERTY(vertex)
  COPY_STATUS_PROPERTY(halfedge)
  COPY_STATUS_PROPERTY(edge)
  COPY_STATUS_PROPERTY(face)
  
#undef COPY_STATUS_PROPERTY
}